

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt.c
# Opt level: O0

HCOSE_ENVELOPED COSE_Enveloped_Init(COSE_INIT_FLAGS flags,cose_errback *perr)

{
  _Bool _Var1;
  COSE_Enveloped *pobj;
  cose_errback *perr_local;
  COSE_Enveloped *pCStack_10;
  COSE_INIT_FLAGS flags_local;
  
  pCStack_10 = (COSE_Enveloped *)calloc(1,0x70);
  if (pCStack_10 == (COSE_Enveloped *)0x0) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_OUT_OF_MEMORY;
    }
    pCStack_10 = (COSE_Enveloped *)0x0;
  }
  else {
    _Var1 = _COSE_Init(flags,(COSE *)pCStack_10,0x60,perr);
    if (_Var1) {
      _COSE_InsertInList(&EnvelopedRoot,(COSE *)pCStack_10);
    }
    else {
      _COSE_Enveloped_Release(pCStack_10);
      free(pCStack_10);
      pCStack_10 = (COSE_Enveloped *)0x0;
    }
  }
  return (HCOSE_ENVELOPED)pCStack_10;
}

Assistant:

HCOSE_ENVELOPED COSE_Enveloped_Init(COSE_INIT_FLAGS flags, CBOR_CONTEXT_COMMA cose_errback * perr)
{
	COSE_Enveloped * pobj = (COSE_Enveloped *)COSE_CALLOC(1, sizeof(COSE_Enveloped), context);
	CHECK_CONDITION(pobj != NULL, COSE_ERR_OUT_OF_MEMORY);

	if (!_COSE_Init(flags,&pobj->m_message, COSE_enveloped_object, CBOR_CONTEXT_PARAM_COMMA perr)) {
		_COSE_Enveloped_Release(pobj);
		COSE_FREE(pobj, context);
		return NULL;
	}

	_COSE_InsertInList(&EnvelopedRoot, &pobj->m_message);

	return (HCOSE_ENVELOPED) pobj;

errorReturn:
	return NULL;
}